

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::StartStruct(Parser *this,string *name,StructDef **dest)

{
  StructDef *pSVar1;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  _Var2;
  long *plVar3;
  undefined8 *in_RCX;
  long *plVar4;
  StructDef *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  pSVar1 = LookupCreateStruct((Parser *)name,(string *)dest,true,true);
  if (pSVar1->predecl == false) {
    Namespace::GetFullyQualifiedName
              (&local_48,*(Namespace **)((long)&name[0xc].field_2 + 8),(string *)dest,1000);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x361eb9);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_58 = *plVar4;
      lStack_50 = plVar3[3];
      local_68 = (StructDef *)&local_58;
    }
    else {
      local_58 = *plVar4;
      local_68 = (StructDef *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    Error(this,name);
    if (local_68 != (StructDef *)&local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pSVar1->predecl = false;
    std::__cxx11::string::_M_assign((string *)pSVar1);
    std::__cxx11::string::_M_assign((string *)&(pSVar1->super_Definition).file);
    local_68 = pSVar1;
    _Var2 = std::
            __remove_if<__gnu_cxx::__normal_iterator<flatbuffers::StructDef**,std::vector<flatbuffers::StructDef*,std::allocator<flatbuffers::StructDef*>>>,__gnu_cxx::__ops::_Iter_equals_val<flatbuffers::StructDef*const>>
                      (*(StructDef ***)((long)&name[6].field_2 + 8),
                       (__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        )name[7]._M_dataplus._M_p,&local_68);
    *_Var2._M_current = pSVar1;
    *in_RCX = pSVar1;
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::StartStruct(const std::string &name, StructDef **dest) {
  auto &struct_def = *LookupCreateStruct(name, true, true);
  if (!struct_def.predecl)
    return Error("datatype already exists: " +
                 current_namespace_->GetFullyQualifiedName(name));
  struct_def.predecl = false;
  struct_def.name = name;
  struct_def.file = file_being_parsed_;
  // Move this struct to the back of the vector just in case it was predeclared,
  // to preserve declaration order.
  *std::remove(structs_.vec.begin(), structs_.vec.end(), &struct_def) =
      &struct_def;
  *dest = &struct_def;
  return NoError();
}